

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

void __thiscall
CVmObjVector::restore_from_file(CVmObjVector *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  uint uVar2;
  uint16_t tmp;
  
  uVar1 = CVmFile::read_uint2(fp);
  uVar2 = CVmFile::read_uint2(fp);
  if ((this->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)0x0;
  }
  alloc_vector(this,(ulong)uVar1);
  *(short *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) = (short)uVar2;
  CVmFile::read_bytes(fp,(this->super_CVmObjCollection).super_CVmObject.ext_ + 4,(ulong)uVar2 * 5);
  CVmObjFixup::fix_dh_array
            (fixups,(this->super_CVmObjCollection).super_CVmObject.ext_ + 4,(ulong)uVar2);
  return;
}

Assistant:

void CVmObjVector::restore_from_file(VMG_ vm_obj_id_t self,
                                     CVmFile *fp, CVmObjFixup *fixups)
{
    size_t ele_cnt;
    size_t alloc_cnt;

    /* read the element count and the full allocation count */
    alloc_cnt = fp->read_uint2();
    ele_cnt = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate the space at the allocation count */
    alloc_vector(vmg_ alloc_cnt);

    /* set the actual in-use element count */
    set_element_count(ele_cnt);

    /* read the contents */
    fp->read_bytes(get_element_ptr(0), calc_alloc_ele(ele_cnt));

    /* fix up object references in the values */
    fixups->fix_dh_array(vmg_ get_element_ptr(0), ele_cnt);
}